

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O1

int64 floatx80_to_int64(floatx80 a)

{
  uint uVar1;
  bits64 absZ1;
  int64 iVar2;
  ulong absZ0;
  bits64 aSig;
  ulong uVar3;
  
  uVar3 = a.low;
  uVar1 = a._0_4_ & 0x7fff;
  if (uVar1 < 0x403e) {
    if (uVar1 < 0x3fff) {
      if (uVar1 == 0x3ffe) {
        absZ0 = 0;
        absZ1 = uVar3;
      }
      else {
        absZ1 = (bits64)(uVar3 != 0);
        absZ0 = 0;
      }
    }
    else {
      absZ0 = uVar3 >> (0x3eU - (char)uVar1 & 0x3f);
      absZ1 = uVar3 << ((char)a.high + 2U & 0x3f);
    }
  }
  else {
    if (uVar1 != 0x403e) {
      float_exception_flags = float_exception_flags | 1;
      if (-1 < (short)a.high) {
        return 0x7fffffffffffffff;
      }
      iVar2 = 0x7fffffffffffffff;
      if (uVar3 == 0x8000000000000000) {
        iVar2 = -0x8000000000000000;
      }
      if (uVar1 != 0x7fff) {
        iVar2 = -0x8000000000000000;
      }
      return iVar2;
    }
    absZ1 = 0;
    absZ0 = uVar3;
  }
  iVar2 = roundAndPackInt64((flag)((a._0_8_ & 0xffff) >> 0xf),absZ0,absZ1);
  return iVar2;
}

Assistant:

int64 floatx80_to_int64( floatx80 a )
{
	flag aSign;
	int32 aExp, shiftCount;
	bits64 aSig, aSigExtra;

	aSig = extractFloatx80Frac( a );
	aExp = extractFloatx80Exp( a );
	aSign = extractFloatx80Sign( a );
	shiftCount = 0x403E - aExp;
	if ( shiftCount <= 0 ) {
		if ( shiftCount ) {
			float_raise( float_flag_invalid );
			if (    ! aSign
					|| (    ( aExp == 0x7FFF )
						&& ( aSig != LIT64( 0x8000000000000000 ) ) )
				) {
				return LIT64( 0x7FFFFFFFFFFFFFFF );
			}
			return (sbits64) LIT64( 0x8000000000000000 );
		}
		aSigExtra = 0;
	}
	else {
		shift64ExtraRightJamming( aSig, 0, shiftCount, &aSig, &aSigExtra );
	}
	return roundAndPackInt64( aSign, aSig, aSigExtra );

}